

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXAnimation.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::AnimationLayer::AnimationLayer
          (AnimationLayer *this,uint64_t id,Element *element,string *name,Document *doc)

{
  Scope *doc_00;
  allocator local_79;
  string local_78;
  shared_ptr<const_Assimp::FBX::PropertyTable> local_58 [2];
  Scope *local_38;
  Scope *sc;
  Document *doc_local;
  string *name_local;
  Element *element_local;
  uint64_t id_local;
  AnimationLayer *this_local;
  
  sc = (Scope *)doc;
  doc_local = (Document *)name;
  name_local = (string *)element;
  element_local = (Element *)id;
  id_local = (uint64_t)this;
  Object::Object(&this->super_Object,id,element,name);
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__AnimationLayer_0037b8e0;
  std::shared_ptr<const_Assimp::FBX::PropertyTable>::shared_ptr(&this->props);
  this->doc = (Document *)sc;
  local_38 = GetRequiredScope((Element *)name_local);
  doc_00 = sc;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_78,"AnimationLayer.FbxAnimLayer",&local_79);
  Util::GetPropertyTable
            ((Util *)local_58,(Document *)doc_00,&local_78,(Element *)name_local,local_38,true);
  std::shared_ptr<const_Assimp::FBX::PropertyTable>::operator=(&this->props,local_58);
  std::shared_ptr<const_Assimp::FBX::PropertyTable>::~shared_ptr(local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  return;
}

Assistant:

AnimationLayer::AnimationLayer(uint64_t id, const Element& element, const std::string& name, const Document& doc)
: Object(id, element, name)
, doc(doc)
{
    const Scope& sc = GetRequiredScope(element);

    // note: the props table here bears little importance and is usually absent
    props = GetPropertyTable(doc,"AnimationLayer.FbxAnimLayer",element,sc, true);
}